

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

int __thiscall deqp::gls::ub::UniformLayout::getUniformIndex(UniformLayout *this,char *name)

{
  bool bVar1;
  size_type sVar2;
  const_reference __lhs;
  int local_24;
  int ndx;
  char *name_local;
  UniformLayout *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::
            vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
            ::size(&this->uniforms);
    if ((int)sVar2 <= local_24) {
      return -1;
    }
    __lhs = std::
            vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
            ::operator[](&this->uniforms,(long)local_24);
    bVar1 = std::operator==(&__lhs->name,name);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int UniformLayout::getUniformIndex (const char* name) const
{
	for (int ndx = 0; ndx < (int)uniforms.size(); ndx++)
	{
		if (uniforms[ndx].name == name)
			return ndx;
	}
	return -1;
}